

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O1

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t markerIndex,
          size_t streamLength)

{
  _Rb_tree_header *p_Var1;
  StreamBlock *pSVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  p_Var1 = &(this->Markers)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->Markers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < markerIndex]
      ) {
    if (*(ulong *)(p_Var4 + 1) >= markerIndex) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, markerIndex < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    pSVar2 = (StreamBlock *)p_Var4[1]._M_parent;
    this->pThisBlock = pSVar2;
    this->ThisPos = markerIndex - pSVar2->Index;
    if (this->pSourceStream == (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0) {
      streamLength = 0;
    }
    this->LengthLeft = streamLength;
  }
  return (_Rb_tree_header *)p_Var4 != p_Var1;
}

Assistant:

bool BacktrackingTokenStream<Token>::BacktrackToMarker(size_t markerIndex, size_t streamLength) {
    const auto iMap = Markers.find(markerIndex);
    // If not found, we fail
    if (iMap == Markers.end())
        return false;

    pThisBlock = iMap->second;
    ThisPos    = markerIndex - pThisBlock->Index;
    LengthLeft = pSourceStream ? streamLength : 0u;
    return true;
}